

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

ostream * std::operator<<(ostream *stream,
                         pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *data)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,'{');
  poVar1 = std::operator<<(poVar1,(string *)data);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = std::operator<<(poVar1,(string *)&data->second);
  std::operator<<(poVar1,'}');
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const vista::pair<Key, T>& data)
{
    stream << '{' << data.first << ',' << data.second << '}';
    return stream;
}